

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O2

int Fxu_SelectSCD(Fxu_Matrix *p,int WeightLimit,Fxu_Var **ppVar1,Fxu_Var **ppVar2)

{
  Fxu_Var *pVar1;
  Fxu_Lit *pFVar1;
  Fxu_Var *pFVar2;
  int iVar3;
  Fxu_ListLit *pFVar4;
  Fxu_Var *pFVar5;
  Fxu_Var **ppFVar6;
  Fxu_Lit *pFVar7;
  int iVar8;
  Fxu_Var **ppFVar9;
  Fxu_ListVar *pFVar10;
  
  pFVar10 = &p->lVars;
  ppFVar9 = &p->pOrderVars;
  iVar8 = -10;
  do {
    pVar1 = pFVar10->pHead;
    if (pVar1 == (Fxu_Var *)0x0) {
      return iVar8;
    }
    p->ppTailVars = ppFVar9;
    p->pOrderVars = (Fxu_Var *)0x0;
    pFVar4 = &pVar1->lLits;
    ppFVar6 = ppFVar9;
    while (pFVar1 = pFVar4->pHead, pFVar7 = pFVar1, pFVar1 != (Fxu_Lit *)0x0) {
      while (pFVar7 = pFVar7->pHNext, pFVar7 != (Fxu_Lit *)0x0) {
        pFVar5 = pFVar7->pVar;
        if (pFVar5->pOrder == (Fxu_Var *)0x0) {
          *ppFVar6 = pFVar5;
          ppFVar6 = &pFVar5->pOrder;
          p->ppTailVars = ppFVar6;
          pFVar5->pOrder = (Fxu_Var *)0x1;
        }
      }
      pFVar4 = (Fxu_ListLit *)&pFVar1->pVNext;
    }
    pFVar5 = *ppFVar9;
    if (pFVar5 == (Fxu_Var *)0x0) {
      pFVar5 = (Fxu_Var *)0x0;
    }
    else {
      for (; pFVar5 != (Fxu_Var *)0x1; pFVar5 = pFVar5->pOrder) {
        iVar3 = Fxu_SingleCountCoincidence(p,pVar1,pFVar5);
        if (iVar3 < 1) {
          __assert_fail("Coin > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuSelect.c"
                        ,0x241,"int Fxu_SelectSCD(Fxu_Matrix *, int, Fxu_Var **, Fxu_Var **)");
        }
        if (iVar8 < iVar3 + -2) {
          *ppVar1 = pVar1;
          *ppVar2 = pFVar5;
          iVar8 = iVar3 + -2;
        }
      }
      pFVar5 = *ppFVar9;
    }
    if (pFVar5 != (Fxu_Var *)0x0) {
      while (pFVar5 != (Fxu_Var *)0x1) {
        pFVar2 = pFVar5->pOrder;
        pFVar5->pOrder = (Fxu_Var *)0x0;
        pFVar5 = pFVar2;
      }
    }
    pFVar10 = (Fxu_ListVar *)&pVar1->pNext;
    *ppFVar9 = (Fxu_Var *)0x0;
    p->ppTailVars = (Fxu_Var **)0x0;
  } while( true );
}

Assistant:

int Fxu_SelectSCD( Fxu_Matrix * p, int WeightLimit, Fxu_Var ** ppVar1, Fxu_Var ** ppVar2 )
{
//    int * pValue2Node = p->pValue2Node;
    Fxu_Var * pVar1;
    Fxu_Var * pVar2, * pVarTemp;
    Fxu_Lit * pLitV, * pLitH;
    int Coin;
    int CounterAll;
    int CounterTest;
    int WeightCur;
    int WeightBest;

    CounterAll = 0;
    CounterTest = 0;

    WeightBest = -10;
    
    // iterate through the columns in the matrix
    Fxu_MatrixForEachVariable( p, pVar1 )
    {
        // start collecting the affected vars
        Fxu_MatrixRingVarsStart( p );

        // go through all the literals of this variable
        for ( pLitV = pVar1->lLits.pHead; pLitV; pLitV = pLitV->pVNext )
        {
            // for this literal, go through all the horizontal literals
            for ( pLitH = pLitV->pHNext; pLitH; pLitH = pLitH->pHNext )
            {
                // get another variable
                pVar2 = pLitH->pVar;
                CounterAll++;
                // skip the var if it is already used
                if ( pVar2->pOrder )
                    continue;
                // skip the var if it belongs to the same node
//                if ( pValue2Node[pVar1->iVar] == pValue2Node[pVar2->iVar] )
//                    continue;
                // collect the var
                Fxu_MatrixRingVarsAdd( p, pVar2 );
            }
        }
        // stop collecting the selected vars
        Fxu_MatrixRingVarsStop( p );

        // iterate through the selected vars
        Fxu_MatrixForEachVarInRing( p, pVar2 )
        {
            CounterTest++;

            // count the coincidence
            Coin = Fxu_SingleCountCoincidence( p, pVar1, pVar2 );
            assert( Coin > 0 );

            // get the new weight
            WeightCur = Coin - 2;

            // compare the weights
            if ( WeightBest < WeightCur )
            {
                WeightBest = WeightCur;
                *ppVar1 = pVar1;
                *ppVar2 = pVar2;
            }
        }
        // unmark the vars
        Fxu_MatrixForEachVarInRingSafe( p, pVar2, pVarTemp )
            pVar2->pOrder = NULL;
        Fxu_MatrixRingVarsReset( p );
    }

//    if ( WeightBest == WeightLimit )
//        return -1;
    return WeightBest;
}